

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

string * utf8_character_abi_cxx11_(string *__return_storage_ptr__,uint codepoint)

{
  byte bVar1;
  byte bVar2;
  allocator<char> local_1a;
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  undefined1 auStack_14 [3];
  char sequence [5];
  uint codepoint_local;
  
  _auStack_14 = codepoint;
  unique0x10000097 = __return_storage_ptr__;
  memset(&local_19,0,5);
  bVar2 = (byte)_auStack_14;
  bVar1 = bVar2;
  if (0x7f < _auStack_14) {
    if (_auStack_14 < 0x800) {
      local_18 = bVar2 & 0x3f | 0x80;
      bVar1 = (byte)((_auStack_14 & 0x7c0) >> 6) | 0xc0;
    }
    else if (_auStack_14 < 0x10000) {
      local_18 = (byte)((_auStack_14 & 0xfc0) >> 6) | 0x80;
      local_17 = bVar2 & 0x3f | 0x80;
      bVar1 = (byte)((_auStack_14 & 0xf000) >> 0xc) | 0xe0;
    }
    else {
      bVar1 = local_19;
      if (_auStack_14 < 0x110000) {
        local_18 = (byte)((_auStack_14 & 0x3f000) >> 0xc) | 0x80;
        local_17 = (byte)((_auStack_14 & 0xfc0) >> 6) | 0x80;
        local_16 = bVar2 & 0x3f | 0x80;
        bVar1 = (byte)((_auStack_14 & 0x1c0000) >> 0x12) | 0xf0;
      }
    }
  }
  local_19 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&local_19,&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::string utf8_character (unsigned int codepoint)
{
  char sequence[5] {};

  // 0xxxxxxx -> 0xxxxxxx
  if (codepoint < 0x80)
  {
    sequence[0] = codepoint;
  }

  // 00000yyy yyxxxxxx -> 110yyyyy 10xxxxxx
  else if (codepoint < 0x800)
  {
    sequence[0] = 0xC0 | (codepoint & 0x7C0) >> 6;
    sequence[1] = 0x80 | (codepoint & 0x3F);
  }

  // zzzzyyyy yyxxxxxx -> 1110zzzz 10yyyyyy 10xxxxxx
  else if (codepoint < 0x10000)
  {
    sequence[0] = 0xE0 | (codepoint & 0xF000) >> 12;
    sequence[1] = 0x80 | (codepoint & 0xFC0)  >> 6;
    sequence[2] = 0x80 | (codepoint & 0x3F);
  }

  // 000wwwzz zzzzyyyy yyxxxxxx -> 11110www 10zzzzzz 10yyyyyy 10xxxxxx
  else if (codepoint < 0x110000)
  {
    sequence[0] = 0xF0 | (codepoint & 0x1C0000) >> 18;
    sequence[1] = 0x80 | (codepoint & 0x03F000) >> 12;
    sequence[2] = 0x80 | (codepoint & 0x0FC0)   >> 6;
    sequence[3] = 0x80 | (codepoint & 0x3F);
  }

  return std::string (sequence);
}